

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int allocateBtreePage(BtShared *pBt,MemPage **ppPage,Pgno *pPgno,Pgno nearby,u8 eMode)

{
  MemPage *pMVar1;
  Pgno PVar2;
  u32 uVar3;
  int iVar4;
  u32 uVar5;
  uint uVar6;
  int iVar7;
  uint in_ECX;
  u32 *in_RDX;
  undefined8 *in_RSI;
  BtShared *in_RDI;
  char in_R8B;
  MemPage *pPg;
  int bNoContent;
  int noContent;
  int d2;
  int dist;
  u32 i;
  uchar *aData;
  Pgno iPage;
  u32 closest;
  Pgno iNewTrunk;
  MemPage *pNewTrunk;
  u8 eType;
  u8 searchList;
  Pgno iTrunk;
  Pgno mxPage;
  MemPage *pPrevTrunk;
  MemPage *pTrunk;
  u32 k;
  u32 n;
  int rc;
  MemPage *pPage1;
  u32 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined8 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  Pgno in_stack_ffffffffffffff6c;
  uint in_stack_ffffffffffffff70;
  Pgno in_stack_ffffffffffffff74;
  Pgno in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  undefined8 in_stack_ffffffffffffff80;
  Pgno key;
  undefined4 *puVar8;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  uint local_70;
  long local_68;
  char local_5a;
  bool local_59;
  int local_34;
  
  key = (Pgno)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  pMVar1 = in_RDI->pPage1;
  PVar2 = btreePagecount(in_RDI);
  uVar3 = sqlite3Get4byte(pMVar1->aData + 0x24);
  iVar4 = (int)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  if (PVar2 <= uVar3) {
    iVar4 = sqlite3CorruptError(0);
    return iVar4;
  }
  if (uVar3 == 0) {
    uVar6 = (uint)(in_RDI->bDoTruncate == '\0');
    iVar7 = sqlite3PagerWrite((PgHdr *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)
                             );
    if (iVar7 != 0) {
      return iVar7;
    }
    in_RDI->nPage = in_RDI->nPage + 1;
    uVar3 = in_RDI->nPage;
    if (uVar3 == (uint)sqlite3PendingByte / in_RDI->pageSize + 1) {
      in_RDI->nPage = in_RDI->nPage + 1;
    }
    if ((in_RDI->autoVacuum != '\0') &&
       (PVar2 = ptrmapPageno(in_RDI,in_RDI->nPage), PVar2 == in_RDI->nPage)) {
      iVar4 = 0;
      local_34 = btreeGetPage((BtShared *)
                              CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                              in_stack_ffffffffffffff74,
                              (MemPage **)CONCAT44(uVar6,in_stack_ffffffffffffff68),0);
      if (local_34 == 0) {
        local_34 = sqlite3PagerWrite((PgHdr *)CONCAT44(uVar3,in_stack_ffffffffffffff58));
        releasePage((MemPage *)0x137a61);
      }
      if (local_34 != 0) {
        return local_34;
      }
      in_RDI->nPage = in_RDI->nPage + 1;
      in_stack_ffffffffffffff58 = in_RDI->nPage;
      if (in_stack_ffffffffffffff58 == (uint)sqlite3PendingByte / in_RDI->pageSize + 1) {
        in_RDI->nPage = in_RDI->nPage + 1;
      }
    }
    sqlite3Put4byte(in_RDI->pPage1->aData + 0x1c,in_RDI->nPage);
    *in_RDX = in_RDI->nPage;
    iVar4 = btreeGetPage((BtShared *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                         in_stack_ffffffffffffff74,
                         (MemPage **)CONCAT44(uVar6,in_stack_ffffffffffffff68),iVar4);
    if (iVar4 != 0) {
      return iVar4;
    }
    local_34 = sqlite3PagerWrite((PgHdr *)CONCAT44(uVar3,in_stack_ffffffffffffff58));
    if (local_34 != 0) {
      releasePage((MemPage *)0x137b6f);
    }
  }
  else {
    local_59 = false;
    if (in_R8B == '\x01') {
      if (in_ECX <= PVar2) {
        iVar4 = ptrmapGet((BtShared *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                          key,(u8 *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                          (Pgno *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
        if (iVar4 != 0) {
          return iVar4;
        }
        local_59 = local_5a == '\x02';
      }
    }
    else {
      local_59 = in_R8B == '\x02';
    }
    iVar4 = sqlite3PagerWrite((PgHdr *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)
                             );
    if (iVar4 != 0) {
      return iVar4;
    }
    sqlite3Put4byte(pMVar1->aData + 0x24,uVar3 - 1);
    do {
      uVar3 = sqlite3Get4byte(pMVar1->aData + 0x20);
      if (PVar2 < uVar3) {
        local_34 = sqlite3CorruptError(0);
      }
      else {
        local_34 = btreeGetPage((BtShared *)
                                CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                                in_stack_ffffffffffffff74,
                                (MemPage **)
                                CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                                (int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
      }
      if (local_34 != 0) break;
      uVar5 = sqlite3Get4byte((u8 *)(puRam0000000000000050 + 1));
      if ((uVar5 != 0) || (local_59)) {
        if ((in_RDI->usableSize >> 2) - 2 < uVar5) {
          local_34 = sqlite3CorruptError(0);
          break;
        }
        if ((local_59) && ((in_ECX == uVar3 || ((uVar3 < in_ECX && (in_R8B == '\x02')))))) {
          *in_RDX = uVar3;
          *in_RSI = 0;
          local_59 = false;
          local_34 = sqlite3PagerWrite((PgHdr *)CONCAT44(in_stack_ffffffffffffff5c,
                                                         in_stack_ffffffffffffff58));
          if (local_34 != 0) break;
          if (uVar5 == 0) {
            *(undefined4 *)(pMVar1->aData + 0x20) = *puRam0000000000000050;
          }
          else {
            uVar3 = sqlite3Get4byte((u8 *)(puRam0000000000000050 + 2));
            if (PVar2 < uVar3) {
              local_34 = sqlite3CorruptError(0);
              break;
            }
            local_34 = btreeGetPage((BtShared *)
                                    CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                                    in_stack_ffffffffffffff74,
                                    (MemPage **)
                                    CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                                    (int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
            if (local_34 != 0) break;
            local_34 = sqlite3PagerWrite((PgHdr *)CONCAT44(in_stack_ffffffffffffff5c,
                                                           in_stack_ffffffffffffff58));
            if (local_34 != 0) {
              releasePage((MemPage *)0x13759a);
              break;
            }
            **(undefined4 **)(local_68 + 0x50) = *puRam0000000000000050;
            sqlite3Put4byte((uchar *)(*(long *)(local_68 + 0x50) + 4),uVar5 - 1);
            memcpy((void *)(*(long *)(local_68 + 0x50) + 8),puRam0000000000000050 + 3,
                   (ulong)((uVar5 - 1) * 4));
            releasePage((MemPage *)0x137605);
            sqlite3Put4byte(pMVar1->aData + 0x20,uVar3);
          }
        }
        else if (uVar5 != 0) {
          puVar8 = puRam0000000000000050;
          if (in_ECX == 0) {
            local_70 = 0;
            uVar6 = local_70;
          }
          else {
            local_70 = 0;
            if (in_R8B == '\x02') {
              in_stack_ffffffffffffff7c = 0;
              while ((uVar6 = local_70, in_stack_ffffffffffffff7c < uVar5 &&
                     (uVar3 = sqlite3Get4byte((u8 *)((long)puVar8 +
                                                    (ulong)(in_stack_ffffffffffffff7c * 4 + 8))),
                     uVar6 = in_stack_ffffffffffffff7c, in_ECX < uVar3))) {
                in_stack_ffffffffffffff7c = in_stack_ffffffffffffff7c + 1;
              }
            }
            else {
              uVar3 = sqlite3Get4byte((u8 *)(puRam0000000000000050 + 2));
              in_stack_ffffffffffffff78 = sqlite3AbsInt32(uVar3 - in_ECX);
              for (in_stack_ffffffffffffff7c = 1; uVar6 = local_70,
                  in_stack_ffffffffffffff7c < uVar5;
                  in_stack_ffffffffffffff7c = in_stack_ffffffffffffff7c + 1) {
                uVar3 = sqlite3Get4byte((u8 *)((long)puVar8 +
                                              (ulong)(in_stack_ffffffffffffff7c * 4 + 8)));
                in_stack_ffffffffffffff74 = sqlite3AbsInt32(uVar3 - in_ECX);
                if ((int)in_stack_ffffffffffffff74 < (int)in_stack_ffffffffffffff78) {
                  in_stack_ffffffffffffff78 = in_stack_ffffffffffffff74;
                  local_70 = in_stack_ffffffffffffff7c;
                }
              }
            }
          }
          local_70 = uVar6;
          uVar3 = sqlite3Get4byte((u8 *)((long)puVar8 + (ulong)(local_70 * 4 + 8)));
          if (PVar2 < uVar3) {
            local_34 = sqlite3CorruptError(0);
            break;
          }
          if (((!local_59) || (uVar3 == in_ECX)) || ((uVar3 < in_ECX && (in_R8B == '\x02')))) {
            *in_RDX = uVar3;
            local_34 = sqlite3PagerWrite((PgHdr *)CONCAT44(in_stack_ffffffffffffff5c,
                                                           in_stack_ffffffffffffff58));
            if (local_34 != 0) break;
            if (local_70 < uVar5 - 1) {
              *(undefined4 *)((long)puVar8 + (ulong)(local_70 * 4 + 8)) =
                   *(undefined4 *)((long)puVar8 + (ulong)(uVar5 * 4 + 4));
            }
            sqlite3Put4byte((uchar *)(puVar8 + 1),uVar5 - 1);
            iVar4 = btreeGetHasContent((BtShared *)
                                       CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                                       ,in_stack_ffffffffffffff6c);
            in_stack_ffffffffffffff70 = (uint)(iVar4 == 0);
            local_34 = btreeGetPage((BtShared *)
                                    CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                                    in_stack_ffffffffffffff74,
                                    (MemPage **)
                                    CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                                    (int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
            if ((local_34 == 0) &&
               (local_34 = sqlite3PagerWrite((PgHdr *)CONCAT44(in_stack_ffffffffffffff5c,
                                                               in_stack_ffffffffffffff58)),
               local_34 != 0)) {
              releasePage((MemPage *)0x137903);
            }
            local_59 = false;
          }
        }
      }
      else {
        local_34 = sqlite3PagerWrite((PgHdr *)CONCAT44(in_stack_ffffffffffffff5c,
                                                       in_stack_ffffffffffffff58));
        if (local_34 != 0) break;
        *in_RDX = uVar3;
        *(undefined4 *)(pMVar1->aData + 0x20) = *puRam0000000000000050;
        *in_RSI = 0;
      }
      releasePage((MemPage *)0x13791c);
    } while (local_59);
  }
  releasePage((MemPage *)0x137b7d);
  releasePage((MemPage *)0x137b87);
  if (local_34 == 0) {
    iVar4 = sqlite3PagerPageRefcount((DbPage *)0x137ba2);
    if (1 < iVar4) {
      releasePage((MemPage *)0x137bb7);
      *in_RSI = 0;
      iVar4 = sqlite3CorruptError(0);
      return iVar4;
    }
    *(undefined1 *)*in_RSI = 0;
  }
  else {
    *in_RSI = 0;
  }
  return local_34;
}

Assistant:

static int allocateBtreePage(
  BtShared *pBt,         /* The btree */
  MemPage **ppPage,      /* Store pointer to the allocated page here */
  Pgno *pPgno,           /* Store the page number here */
  Pgno nearby,           /* Search for a page near this one */
  u8 eMode               /* BTALLOC_EXACT, BTALLOC_LT, or BTALLOC_ANY */
){
  MemPage *pPage1;
  int rc;
  u32 n;     /* Number of pages on the freelist */
  u32 k;     /* Number of leaves on the trunk of the freelist */
  MemPage *pTrunk = 0;
  MemPage *pPrevTrunk = 0;
  Pgno mxPage;     /* Total size of the database file */

  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( eMode==BTALLOC_ANY || (nearby>0 && IfNotOmitAV(pBt->autoVacuum)) );
  pPage1 = pBt->pPage1;
  mxPage = btreePagecount(pBt);
  /* EVIDENCE-OF: R-05119-02637 The 4-byte big-endian integer at offset 36
  ** stores stores the total number of pages on the freelist. */
  n = get4byte(&pPage1->aData[36]);
  testcase( n==mxPage-1 );
  if( n>=mxPage ){
    return SQLITE_CORRUPT_BKPT;
  }
  if( n>0 ){
    /* There are pages on the freelist.  Reuse one of those pages. */
    Pgno iTrunk;
    u8 searchList = 0; /* If the free-list must be searched for 'nearby' */
    
    /* If eMode==BTALLOC_EXACT and a query of the pointer-map
    ** shows that the page 'nearby' is somewhere on the free-list, then
    ** the entire-list will be searched for that page.
    */
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( eMode==BTALLOC_EXACT ){
      if( nearby<=mxPage ){
        u8 eType;
        assert( nearby>0 );
        assert( pBt->autoVacuum );
        rc = ptrmapGet(pBt, nearby, &eType, 0);
        if( rc ) return rc;
        if( eType==PTRMAP_FREEPAGE ){
          searchList = 1;
        }
      }
    }else if( eMode==BTALLOC_LE ){
      searchList = 1;
    }
#endif

    /* Decrement the free-list count by 1. Set iTrunk to the index of the
    ** first free-list trunk page. iPrevTrunk is initially 1.
    */
    rc = sqlite3PagerWrite(pPage1->pDbPage);
    if( rc ) return rc;
    put4byte(&pPage1->aData[36], n-1);

    /* The code within this loop is run only once if the 'searchList' variable
    ** is not true. Otherwise, it runs once for each trunk-page on the
    ** free-list until the page 'nearby' is located (eMode==BTALLOC_EXACT)
    ** or until a page less than 'nearby' is located (eMode==BTALLOC_LT)
    */
    do {
      pPrevTrunk = pTrunk;
      if( pPrevTrunk ){
        /* EVIDENCE-OF: R-01506-11053 The first integer on a freelist trunk page
        ** is the page number of the next freelist trunk page in the list or
        ** zero if this is the last freelist trunk page. */
        iTrunk = get4byte(&pPrevTrunk->aData[0]);
      }else{
        /* EVIDENCE-OF: R-59841-13798 The 4-byte big-endian integer at offset 32
        ** stores the page number of the first page of the freelist, or zero if
        ** the freelist is empty. */
        iTrunk = get4byte(&pPage1->aData[32]);
      }
      testcase( iTrunk==mxPage );
      if( iTrunk>mxPage ){
        rc = SQLITE_CORRUPT_BKPT;
      }else{
        rc = btreeGetPage(pBt, iTrunk, &pTrunk, 0);
      }
      if( rc ){
        pTrunk = 0;
        goto end_allocate_page;
      }
      assert( pTrunk!=0 );
      assert( pTrunk->aData!=0 );
      /* EVIDENCE-OF: R-13523-04394 The second integer on a freelist trunk page
      ** is the number of leaf page pointers to follow. */
      k = get4byte(&pTrunk->aData[4]);
      if( k==0 && !searchList ){
        /* The trunk has no leaves and the list is not being searched. 
        ** So extract the trunk page itself and use it as the newly 
        ** allocated page */
        assert( pPrevTrunk==0 );
        rc = sqlite3PagerWrite(pTrunk->pDbPage);
        if( rc ){
          goto end_allocate_page;
        }
        *pPgno = iTrunk;
        memcpy(&pPage1->aData[32], &pTrunk->aData[0], 4);
        *ppPage = pTrunk;
        pTrunk = 0;
        TRACE(("ALLOCATE: %d trunk - %d free pages left\n", *pPgno, n-1));
      }else if( k>(u32)(pBt->usableSize/4 - 2) ){
        /* Value of k is out of range.  Database corruption */
        rc = SQLITE_CORRUPT_BKPT;
        goto end_allocate_page;
#ifndef SQLITE_OMIT_AUTOVACUUM
      }else if( searchList 
            && (nearby==iTrunk || (iTrunk<nearby && eMode==BTALLOC_LE)) 
      ){
        /* The list is being searched and this trunk page is the page
        ** to allocate, regardless of whether it has leaves.
        */
        *pPgno = iTrunk;
        *ppPage = pTrunk;
        searchList = 0;
        rc = sqlite3PagerWrite(pTrunk->pDbPage);
        if( rc ){
          goto end_allocate_page;
        }
        if( k==0 ){
          if( !pPrevTrunk ){
            memcpy(&pPage1->aData[32], &pTrunk->aData[0], 4);
          }else{
            rc = sqlite3PagerWrite(pPrevTrunk->pDbPage);
            if( rc!=SQLITE_OK ){
              goto end_allocate_page;
            }
            memcpy(&pPrevTrunk->aData[0], &pTrunk->aData[0], 4);
          }
        }else{
          /* The trunk page is required by the caller but it contains 
          ** pointers to free-list leaves. The first leaf becomes a trunk
          ** page in this case.
          */
          MemPage *pNewTrunk;
          Pgno iNewTrunk = get4byte(&pTrunk->aData[8]);
          if( iNewTrunk>mxPage ){ 
            rc = SQLITE_CORRUPT_BKPT;
            goto end_allocate_page;
          }
          testcase( iNewTrunk==mxPage );
          rc = btreeGetPage(pBt, iNewTrunk, &pNewTrunk, 0);
          if( rc!=SQLITE_OK ){
            goto end_allocate_page;
          }
          rc = sqlite3PagerWrite(pNewTrunk->pDbPage);
          if( rc!=SQLITE_OK ){
            releasePage(pNewTrunk);
            goto end_allocate_page;
          }
          memcpy(&pNewTrunk->aData[0], &pTrunk->aData[0], 4);
          put4byte(&pNewTrunk->aData[4], k-1);
          memcpy(&pNewTrunk->aData[8], &pTrunk->aData[12], (k-1)*4);
          releasePage(pNewTrunk);
          if( !pPrevTrunk ){
            assert( sqlite3PagerIswriteable(pPage1->pDbPage) );
            put4byte(&pPage1->aData[32], iNewTrunk);
          }else{
            rc = sqlite3PagerWrite(pPrevTrunk->pDbPage);
            if( rc ){
              goto end_allocate_page;
            }
            put4byte(&pPrevTrunk->aData[0], iNewTrunk);
          }
        }
        pTrunk = 0;
        TRACE(("ALLOCATE: %d trunk - %d free pages left\n", *pPgno, n-1));
#endif
      }else if( k>0 ){
        /* Extract a leaf from the trunk */
        u32 closest;
        Pgno iPage;
        unsigned char *aData = pTrunk->aData;
        if( nearby>0 ){
          u32 i;
          closest = 0;
          if( eMode==BTALLOC_LE ){
            for(i=0; i<k; i++){
              iPage = get4byte(&aData[8+i*4]);
              if( iPage<=nearby ){
                closest = i;
                break;
              }
            }
          }else{
            int dist;
            dist = sqlite3AbsInt32(get4byte(&aData[8]) - nearby);
            for(i=1; i<k; i++){
              int d2 = sqlite3AbsInt32(get4byte(&aData[8+i*4]) - nearby);
              if( d2<dist ){
                closest = i;
                dist = d2;
              }
            }
          }
        }else{
          closest = 0;
        }

        iPage = get4byte(&aData[8+closest*4]);
        testcase( iPage==mxPage );
        if( iPage>mxPage ){
          rc = SQLITE_CORRUPT_BKPT;
          goto end_allocate_page;
        }
        testcase( iPage==mxPage );
        if( !searchList 
         || (iPage==nearby || (iPage<nearby && eMode==BTALLOC_LE)) 
        ){
          int noContent;
          *pPgno = iPage;
          TRACE(("ALLOCATE: %d was leaf %d of %d on trunk %d"
                 ": %d more free pages\n",
                 *pPgno, closest+1, k, pTrunk->pgno, n-1));
          rc = sqlite3PagerWrite(pTrunk->pDbPage);
          if( rc ) goto end_allocate_page;
          if( closest<k-1 ){
            memcpy(&aData[8+closest*4], &aData[4+k*4], 4);
          }
          put4byte(&aData[4], k-1);
          noContent = !btreeGetHasContent(pBt, *pPgno)? PAGER_GET_NOCONTENT : 0;
          rc = btreeGetPage(pBt, *pPgno, ppPage, noContent);
          if( rc==SQLITE_OK ){
            rc = sqlite3PagerWrite((*ppPage)->pDbPage);
            if( rc!=SQLITE_OK ){
              releasePage(*ppPage);
            }
          }
          searchList = 0;
        }
      }
      releasePage(pPrevTrunk);
      pPrevTrunk = 0;
    }while( searchList );
  }else{
    /* There are no pages on the freelist, so append a new page to the
    ** database image.
    **
    ** Normally, new pages allocated by this block can be requested from the
    ** pager layer with the 'no-content' flag set. This prevents the pager
    ** from trying to read the pages content from disk. However, if the
    ** current transaction has already run one or more incremental-vacuum
    ** steps, then the page we are about to allocate may contain content
    ** that is required in the event of a rollback. In this case, do
    ** not set the no-content flag. This causes the pager to load and journal
    ** the current page content before overwriting it.
    **
    ** Note that the pager will not actually attempt to load or journal 
    ** content for any page that really does lie past the end of the database
    ** file on disk. So the effects of disabling the no-content optimization
    ** here are confined to those pages that lie between the end of the
    ** database image and the end of the database file.
    */
    int bNoContent = (0==IfNotOmitAV(pBt->bDoTruncate))? PAGER_GET_NOCONTENT:0;

    rc = sqlite3PagerWrite(pBt->pPage1->pDbPage);
    if( rc ) return rc;
    pBt->nPage++;
    if( pBt->nPage==PENDING_BYTE_PAGE(pBt) ) pBt->nPage++;

#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pBt->autoVacuum && PTRMAP_ISPAGE(pBt, pBt->nPage) ){
      /* If *pPgno refers to a pointer-map page, allocate two new pages
      ** at the end of the file instead of one. The first allocated page
      ** becomes a new pointer-map page, the second is used by the caller.
      */
      MemPage *pPg = 0;
      TRACE(("ALLOCATE: %d from end of file (pointer-map page)\n", pBt->nPage));
      assert( pBt->nPage!=PENDING_BYTE_PAGE(pBt) );
      rc = btreeGetPage(pBt, pBt->nPage, &pPg, bNoContent);
      if( rc==SQLITE_OK ){
        rc = sqlite3PagerWrite(pPg->pDbPage);
        releasePage(pPg);
      }
      if( rc ) return rc;
      pBt->nPage++;
      if( pBt->nPage==PENDING_BYTE_PAGE(pBt) ){ pBt->nPage++; }
    }
#endif
    put4byte(28 + (u8*)pBt->pPage1->aData, pBt->nPage);
    *pPgno = pBt->nPage;

    assert( *pPgno!=PENDING_BYTE_PAGE(pBt) );
    rc = btreeGetPage(pBt, *pPgno, ppPage, bNoContent);
    if( rc ) return rc;
    rc = sqlite3PagerWrite((*ppPage)->pDbPage);
    if( rc!=SQLITE_OK ){
      releasePage(*ppPage);
    }
    TRACE(("ALLOCATE: %d from end of file\n", *pPgno));
  }

  assert( *pPgno!=PENDING_BYTE_PAGE(pBt) );

end_allocate_page:
  releasePage(pTrunk);
  releasePage(pPrevTrunk);
  if( rc==SQLITE_OK ){
    if( sqlite3PagerPageRefcount((*ppPage)->pDbPage)>1 ){
      releasePage(*ppPage);
      *ppPage = 0;
      return SQLITE_CORRUPT_BKPT;
    }
    (*ppPage)->isInit = 0;
  }else{
    *ppPage = 0;
  }
  assert( rc!=SQLITE_OK || sqlite3PagerIswriteable((*ppPage)->pDbPage) );
  return rc;
}